

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

void jsonReturnFromBlob(JsonParse *pParse,u32 i,sqlite3_context *pCtx,int textOnly)

{
  Mem *pMVar1;
  sqlite3 *db;
  u32 uVar2;
  u32 uVar3;
  u32 uVar4;
  int iVar5;
  int iVar6;
  char *pcVar7;
  size_t sVar8;
  byte bVar9;
  u8 uVar10;
  uint uVar11;
  uint uVar12;
  uint uVar13;
  i64 val;
  sqlite3_context *val_00;
  u8 *puVar14;
  uint uVar15;
  ulong uVar16;
  ulong uVar17;
  long in_FS_OFFSET;
  double r;
  u32 sz;
  JsonParse x;
  sqlite3_int64 iRes;
  double local_118;
  u32 local_10c;
  undefined1 local_108 [16];
  char *local_f8;
  sqlite3 *psStack_f0;
  undefined1 *local_e8;
  undefined1 *puStack_e0;
  undefined1 *local_d8;
  undefined1 *puStack_d0;
  u8 *local_c8;
  JsonString local_c0;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_10c = 0xaaaaaaaa;
  pMVar1 = pCtx->pOut;
  db = pMVar1->db;
  uVar3 = jsonbPayloadSize(pParse,i,&local_10c);
  uVar2 = local_10c;
  if (uVar3 == 0) {
    pCtx->isError = 1;
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      sqlite3VdbeMemSetStr
                (pMVar1,"malformed JSON",-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
      return;
    }
    goto LAB_001bed28;
  }
  puVar14 = pParse->aBlob;
  switch(puVar14[i] & 0xf) {
  case 0:
    if (local_10c != 0) goto switchD_001be665_default;
    if ((pMVar1->flags & 0x9000) != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        vdbeMemClearExternAndSetNull(pMVar1);
        return;
      }
      goto LAB_001bed28;
    }
    pMVar1->flags = 1;
    break;
  case 1:
    if (local_10c != 0) goto switchD_001be665_default;
    if ((pMVar1->flags & 0x9000) != 0) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        val = 1;
LAB_001be8f5:
        vdbeReleaseAndSetInt64(pMVar1,val);
        return;
      }
      goto LAB_001bed28;
    }
    (pMVar1->u).r = 4.94065645841247e-324;
LAB_001bec7c:
    pMVar1->flags = 4;
    break;
  case 2:
    if (local_10c == 0) {
      if ((pMVar1->flags & 0x9000) != 0) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
          val = 0;
          goto LAB_001be8f5;
        }
        goto LAB_001bed28;
      }
      (pMVar1->u).r = 0.0;
      goto LAB_001bec7c;
    }
  default:
switchD_001be665_default:
    pCtx->isError = 1;
    sqlite3VdbeMemSetStr
              (pCtx->pOut,"malformed JSON",-1,'\x01',(_func_void_void_ptr *)0xffffffffffffffff);
    break;
  case 3:
  case 4:
    local_c0.pCtx = (sqlite3_context *)0x0;
    iVar6 = 3;
    if (local_10c == 0) {
LAB_001bebd5:
      (*(code *)((long)&DAT_00202efc + (long)(int)(&DAT_00202efc)[iVar6 - 2]))();
      return;
    }
    uVar10 = puVar14[uVar3 + i];
    if (uVar10 == '-') {
      if (local_10c == 1) goto LAB_001bebd5;
      uVar3 = uVar3 + 1;
      local_10c = local_10c - 1;
    }
    uVar2 = local_10c;
    pcVar7 = sqlite3DbStrNDup(db,(char *)(puVar14 + (uVar3 + i)),(long)(int)local_10c);
    if (pcVar7 == (char *)0x0) {
      iVar6 = 4;
      goto LAB_001bebd5;
    }
    iVar5 = sqlite3DecOrHexToI64(pcVar7,(i64 *)&local_c0);
    sqlite3DbFreeNN(db,pcVar7);
    if (iVar5 == 0) {
      val_00 = (sqlite3_context *)-(long)local_c0.pCtx;
      if (uVar10 != '-') {
        val_00 = local_c0.pCtx;
      }
      pMVar1 = pCtx->pOut;
      if ((pMVar1->flags & 0x9000) == 0) {
        (pMVar1->u).i = (i64)val_00;
        pMVar1->flags = 4;
      }
      else {
        vdbeReleaseAndSetInt64(pMVar1,(i64)val_00);
      }
    }
    else {
      if ((uVar10 != '-') || (iVar5 != 3)) {
        iVar6 = (uint)(iVar5 != 1) * 2 + 3;
        if ((uVar10 == '-') && (iVar5 != 1)) {
          local_10c = uVar2 + 1;
          iVar6 = 5;
        }
        goto LAB_001bebd5;
      }
      pMVar1 = pCtx->pOut;
      if ((pMVar1->flags & 0x9000) == 0) {
        (pMVar1->u).r = -0.0;
        pMVar1->flags = 4;
      }
      else {
        vdbeReleaseAndSetInt64(pMVar1,-0x8000000000000000);
      }
    }
    break;
  case 5:
  case 6:
    local_118 = -NAN;
    if (local_10c != 0) {
      pcVar7 = sqlite3DbStrNDup(db,(char *)(pParse->aBlob + (uVar3 + i)),(long)(int)local_10c);
      if (pcVar7 == (char *)0x0) goto LAB_001becf9;
      sVar8 = strlen(pcVar7);
      iVar6 = sqlite3AtoF(pcVar7,&local_118,(uint)sVar8 & 0x3fffffff,'\x01');
      sqlite3DbFreeNN(db,pcVar7);
      if (0 < iVar6) {
        sqlite3VdbeMemSetDouble(pCtx->pOut,local_118);
        break;
      }
    }
    goto switchD_001be665_default;
  case 7:
  case 10:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
      puVar14 = puVar14 + (uVar3 + i);
      uVar10 = '\x01';
      uVar13 = local_10c;
LAB_001be80a:
      setResultStrOrError(pCtx,(char *)puVar14,uVar13,uVar10,
                          (_func_void_void_ptr *)0xffffffffffffffff);
      return;
    }
    goto LAB_001bed28;
  case 8:
  case 9:
    if (db == (sqlite3 *)0x0) {
      pcVar7 = (char *)sqlite3Malloc((ulong)(local_10c + 1));
    }
    else {
      pcVar7 = (char *)sqlite3DbMallocRawNN(db,(ulong)(local_10c + 1));
    }
    if (pcVar7 != (char *)0x0) {
      if (uVar2 == 0) {
        uVar16 = 0;
      }
      else {
        uVar13 = 0;
        uVar17 = 0;
        do {
          uVar15 = (uint)uVar17;
          if (puVar14[(ulong)uVar13 + (ulong)(uVar3 + i)] == '\\') {
            local_c0.pCtx = (sqlite3_context *)CONCAT44(local_c0.pCtx._4_4_,0xaaaaaaaa);
            uVar4 = jsonUnescapeOneChar((char *)(puVar14 + (ulong)uVar13 + (ulong)(uVar3 + i)),
                                        uVar2 - uVar13,(u32 *)&local_c0);
            if ((uint)local_c0.pCtx < 0x80) {
              iVar6 = 1;
              uVar12 = uVar15;
              uVar11 = (uint)local_c0.pCtx;
LAB_001bea3b:
              uVar17 = (ulong)(uVar15 + iVar6);
              pcVar7[uVar12] = (char)uVar11;
            }
            else {
              bVar9 = (byte)local_c0.pCtx;
              if ((uint)local_c0.pCtx < 0x800) {
                uVar12 = uVar15 + 1;
                pcVar7[uVar17] = (byte)((uint)local_c0.pCtx >> 6) | 0xc0;
                uVar11 = (uint)(bVar9 & 0x3f | 0x80);
                iVar6 = 2;
                goto LAB_001bea3b;
              }
              if ((uint)local_c0.pCtx < 0x10000) {
                pcVar7[uVar17] = (byte)((uint)local_c0.pCtx >> 0xc) | 0xe0;
                uVar12 = uVar15 + 2;
                pcVar7[uVar15 + 1] = (byte)((uint)local_c0.pCtx >> 6) & 0x3f | 0x80;
                uVar11 = (uint)(bVar9 & 0x3f | 0x80);
                iVar6 = 3;
                goto LAB_001bea3b;
              }
              if ((uint)local_c0.pCtx != 0x99999) {
                pcVar7[uVar17] = (byte)((uint)local_c0.pCtx >> 0x12) | 0xf0;
                pcVar7[uVar15 + 1] = (byte)((uint)local_c0.pCtx >> 0xc) & 0x3f | 0x80;
                uVar12 = uVar15 + 3;
                pcVar7[uVar15 + 2] = (byte)((uint)local_c0.pCtx >> 6) & 0x3f | 0x80;
                uVar11 = (uint)(bVar9 & 0x3f | 0x80);
                iVar6 = 4;
                goto LAB_001bea3b;
              }
            }
            uVar13 = (uVar13 + uVar4) - 1;
            uVar16 = uVar17;
          }
          else {
            uVar16 = (ulong)(uVar15 + 1);
            pcVar7[uVar17] = puVar14[(ulong)uVar13 + (ulong)(uVar3 + i)];
          }
          uVar13 = uVar13 + 1;
          uVar17 = uVar16;
        } while (uVar13 < uVar2);
      }
      pcVar7[uVar16] = '\0';
      setResultStrOrError(pCtx,pcVar7,(int)uVar16,'\x01',sqlite3OomClear);
      if (pcVar7 != (char *)0x0) break;
    }
LAB_001becf9:
    sqlite3_result_error_nomem(pCtx);
    break;
  case 0xb:
  case 0xc:
    puVar14 = puVar14 + i;
    if ((textOnly == 0) && (((ulong)pCtx->pFunc->pUserData & 8) != 0)) {
      if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
        uVar10 = '\0';
        uVar13 = local_10c + uVar3;
        goto LAB_001be80a;
      }
      goto LAB_001bed28;
    }
    uVar13 = local_10c + uVar3;
    local_c8 = &DAT_aaaaaaaaaaaaaaaa;
    local_d8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_d0 = &DAT_aaaaaaaaaaaaaaaa;
    local_e8 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_e0 = &DAT_aaaaaaaaaaaaaaaa;
    local_f8 = &DAT_aaaaaaaaaaaaaaaa;
    psStack_f0 = (sqlite3 *)&DAT_aaaaaaaaaaaaaaaa;
    local_108._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_108._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    memset(&local_c0,0xaa,0x88);
    local_f8 = (char *)0x0;
    psStack_f0 = (sqlite3 *)0x0;
    local_e8 = (undefined1 *)0x0;
    puStack_e0 = (undefined1 *)0x0;
    local_d8 = (undefined1 *)0x0;
    puStack_d0 = (undefined1 *)0x0;
    local_c8 = (u8 *)0x0;
    local_108._12_4_ = 0;
    local_108._8_4_ = uVar13;
    local_c0.zBuf = local_c0.zSpace;
    local_c0.nAlloc = 100;
    local_c0.nUsed = 0;
    local_c0.bStatic = '\x01';
    local_c0.eErr = '\0';
    local_108._0_8_ = puVar14;
    local_c0.pCtx = pCtx;
    jsonTranslateBlobToText((JsonParse *)local_108,0,&local_c0);
    jsonReturnString(&local_c0,(JsonParse *)0x0,(sqlite3_context *)0x0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
LAB_001bed28:
  __stack_chk_fail();
}

Assistant:

static void jsonReturnFromBlob(
  JsonParse *pParse,          /* Complete JSON parse tree */
  u32 i,                      /* Index of the node */
  sqlite3_context *pCtx,      /* Return value for this function */
  int textOnly                /* return text JSON.  Disregard user-data */
){
  u32 n, sz;
  int rc;
  sqlite3 *db = sqlite3_context_db_handle(pCtx);

  n = jsonbPayloadSize(pParse, i, &sz);
  if( n==0 ){
    sqlite3_result_error(pCtx, "malformed JSON", -1);
    return;
  }
  switch( pParse->aBlob[i] & 0x0f ){
    case JSONB_NULL: {
      if( sz ) goto returnfromblob_malformed;
      sqlite3_result_null(pCtx);
      break;
    }
    case JSONB_TRUE: {
      if( sz ) goto returnfromblob_malformed;
      sqlite3_result_int(pCtx, 1);
      break;
    }
    case JSONB_FALSE: {
      if( sz ) goto returnfromblob_malformed;
      sqlite3_result_int(pCtx, 0);
      break;
    }
    case JSONB_INT5:
    case JSONB_INT: {
      sqlite3_int64 iRes = 0;
      char *z;
      int bNeg = 0;
      char x;
      if( sz==0 ) goto returnfromblob_malformed;
      x = (char)pParse->aBlob[i+n];
      if( x=='-' ){
        if( sz<2 ) goto returnfromblob_malformed;
        n++;
        sz--;
        bNeg = 1;
      }
      z = sqlite3DbStrNDup(db, (const char*)&pParse->aBlob[i+n], (int)sz);
      if( z==0 ) goto returnfromblob_oom;
      rc = sqlite3DecOrHexToI64(z, &iRes);
      sqlite3DbFree(db, z);
      if( rc==0 ){
        sqlite3_result_int64(pCtx, bNeg ? -iRes : iRes);
      }else if( rc==3 && bNeg ){
        sqlite3_result_int64(pCtx, SMALLEST_INT64);
      }else if( rc==1 ){
        goto returnfromblob_malformed;
      }else{
        if( bNeg ){ n--; sz++; }
        goto to_double;
      }
      break;
    }
    case JSONB_FLOAT5:
    case JSONB_FLOAT: {
      double r;
      char *z;
      if( sz==0 ) goto returnfromblob_malformed;
    to_double:
      z = sqlite3DbStrNDup(db, (const char*)&pParse->aBlob[i+n], (int)sz);
      if( z==0 ) goto returnfromblob_oom;
      rc = sqlite3AtoF(z, &r, sqlite3Strlen30(z), SQLITE_UTF8);
      sqlite3DbFree(db, z);
      if( rc<=0 ) goto returnfromblob_malformed;
      sqlite3_result_double(pCtx, r);
      break;
    }
    case JSONB_TEXTRAW:
    case JSONB_TEXT: {
      sqlite3_result_text(pCtx, (char*)&pParse->aBlob[i+n], sz,
                          SQLITE_TRANSIENT);
      break;
    }
    case JSONB_TEXT5:
    case JSONB_TEXTJ: {
      /* Translate JSON formatted string into raw text */
      u32 iIn, iOut;
      const char *z;
      char *zOut;
      u32 nOut = sz;
      z = (const char*)&pParse->aBlob[i+n];
      zOut = sqlite3DbMallocRaw(db, nOut+1);
      if( zOut==0 ) goto returnfromblob_oom;
      for(iIn=iOut=0; iIn<sz; iIn++){
        char c = z[iIn];
        if( c=='\\' ){
          u32 v;
          u32 szEscape = jsonUnescapeOneChar(&z[iIn], sz-iIn, &v);
          if( v<=0x7f ){
            zOut[iOut++] = (char)v;
          }else if( v<=0x7ff ){
            assert( szEscape>=2 );
            zOut[iOut++] = (char)(0xc0 | (v>>6));
            zOut[iOut++] = 0x80 | (v&0x3f);
          }else if( v<0x10000 ){
            assert( szEscape>=3 );
            zOut[iOut++] = 0xe0 | (v>>12);
            zOut[iOut++] = 0x80 | ((v>>6)&0x3f);
            zOut[iOut++] = 0x80 | (v&0x3f);
          }else if( v==JSON_INVALID_CHAR ){
            /* Silently ignore illegal unicode */
          }else{
            assert( szEscape>=4 );
            zOut[iOut++] = 0xf0 | (v>>18);
            zOut[iOut++] = 0x80 | ((v>>12)&0x3f);
            zOut[iOut++] = 0x80 | ((v>>6)&0x3f);
            zOut[iOut++] = 0x80 | (v&0x3f);
          }
          iIn += szEscape - 1;
        }else{
          zOut[iOut++] = c;
        }
      } /* end for() */
      assert( iOut<=nOut );
      zOut[iOut] = 0;
      sqlite3_result_text(pCtx, zOut, iOut, SQLITE_DYNAMIC);
      break;
    }
    case JSONB_ARRAY:
    case JSONB_OBJECT: {
      int flags = textOnly ? 0 : SQLITE_PTR_TO_INT(sqlite3_user_data(pCtx));
      if( flags & JSON_BLOB ){
        sqlite3_result_blob(pCtx, &pParse->aBlob[i], sz+n, SQLITE_TRANSIENT);
      }else{
        jsonReturnTextJsonFromBlob(pCtx, &pParse->aBlob[i], sz+n);
      }
      break;
    }
    default: {
      goto returnfromblob_malformed;
    }
  }
  return;

returnfromblob_oom:
  sqlite3_result_error_nomem(pCtx);
  return;

returnfromblob_malformed:
  sqlite3_result_error(pCtx, "malformed JSON", -1);
  return;
}